

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::Scrollbar(ImGuiAxis axis)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float id_00;
  float *pfVar5;
  float size_contents;
  float size_avail;
  ImDrawCornerFlags rounding_corners;
  ImRect bb;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiAxis axis_local;
  
  unique0x00012000 = GImGui->CurrentWindow;
  bb.Max.x = (float)GetWindowScrollbarID(unique0x00012000,axis);
  KeepAliveID((ImGuiID)bb.Max.x);
  _size_avail = GetWindowScrollbarRect(stack0xffffffffffffffe0,axis);
  size_contents = 0.0;
  if (axis == ImGuiAxis_X) {
    size_contents = 5.60519e-45;
    if ((stack0xffffffffffffffe0->ScrollbarY & 1U) == 0) {
      size_contents = 1.68156e-44;
    }
  }
  else {
    if (((stack0xffffffffffffffe0->Flags & 1U) != 0) &&
       ((stack0xffffffffffffffe0->Flags & 0x400U) == 0)) {
      size_contents = 2.8026e-45;
    }
    if ((stack0xffffffffffffffe0->ScrollbarX & 1U) == 0) {
      size_contents = (float)((uint)size_contents | 8);
    }
  }
  pfVar5 = ImVec2::operator[](&(stack0xffffffffffffffe0->InnerRect).Max,(long)axis);
  fVar1 = *pfVar5;
  pfVar5 = ImVec2::operator[](&(stack0xffffffffffffffe0->InnerRect).Min,(long)axis);
  fVar2 = *pfVar5;
  pfVar5 = ImVec2::operator[](&stack0xffffffffffffffe0->ContentSize,(long)axis);
  fVar3 = *pfVar5;
  pfVar5 = ImVec2::operator[](&stack0xffffffffffffffe0->WindowPadding,(long)axis);
  id_00 = bb.Max.x;
  fVar4 = *pfVar5;
  pfVar5 = ImVec2::operator[](&stack0xffffffffffffffe0->Scroll,(long)axis);
  ScrollbarEx((ImRect *)&size_avail,(ImGuiID)id_00,axis,pfVar5,fVar1 - fVar2,fVar4 + fVar4 + fVar3,
              (ImDrawCornerFlags)size_contents);
  return;
}

Assistant:

void ImGui::Scrollbar(ImGuiAxis axis)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const ImGuiID id = GetWindowScrollbarID(window, axis);
    KeepAliveID(id);

    // Calculate scrollbar bounding box
    ImRect bb = GetWindowScrollbarRect(window, axis);
    ImDrawCornerFlags rounding_corners = 0;
    if (axis == ImGuiAxis_X)
    {
        rounding_corners |= ImDrawCornerFlags_BotLeft;
        if (!window->ScrollbarY)
            rounding_corners |= ImDrawCornerFlags_BotRight;
    }
    else
    {
        if ((window->Flags & ImGuiWindowFlags_NoTitleBar) && !(window->Flags & ImGuiWindowFlags_MenuBar))
            rounding_corners |= ImDrawCornerFlags_TopRight;
        if (!window->ScrollbarX)
            rounding_corners |= ImDrawCornerFlags_BotRight;
    }
    float size_avail = window->InnerRect.Max[axis] - window->InnerRect.Min[axis];
    float size_contents = window->ContentSize[axis] + window->WindowPadding[axis] * 2.0f;
    ScrollbarEx(bb, id, axis, &window->Scroll[axis], size_avail, size_contents, rounding_corners);
}